

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

void __thiscall libtorrent::aux::peer_list::update_connect_candidates(peer_list *this,int delta)

{
  int iVar1;
  int iVar2;
  
  if (delta != 0) {
    iVar1 = this->m_num_connect_candidates + delta;
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    if (-1 < delta) {
      iVar2 = iVar1;
    }
    this->m_num_connect_candidates = iVar2;
  }
  return;
}

Assistant:

void peer_list::update_connect_candidates(int delta)
	{
		TORRENT_ASSERT(is_single_thread());
		if (delta == 0) return;
		m_num_connect_candidates += delta;
		if (delta < 0)
		{
			TORRENT_ASSERT(m_num_connect_candidates >= 0);
			if (m_num_connect_candidates < 0) m_num_connect_candidates = 0;
		}
	}